

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void writeTiledRgbaMIP2(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Rgba *pRVar5;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  Box2i range;
  int tileX;
  int tileY;
  int level;
  Array2D<Imf_3_2::Rgba> pixels;
  TiledRgbaOutputFile out;
  int iVar6;
  undefined4 in_stack_ffffffffffffff14;
  Vec2<float> *this;
  int xMax;
  int in_stack_ffffffffffffff2c;
  int h;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int yLevel;
  undefined4 in_stack_ffffffffffffff64;
  int local_78;
  int local_74;
  int local_68;
  int local_64;
  int local_60;
  Array2D<Imf_3_2::Rgba> local_50;
  Vec2<float> local_38;
  Rgba local_30 [6];
  
  this = &local_38;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  uVar1 = Imf_3_2::globalThreadCount();
  h = 3;
  xMax = 0;
  iVar6 = 0;
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_30,in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,1,0,0xf);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
             ,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_60 = 0;
  while( true ) {
    yLevel = local_60;
    iVar2 = Imf_3_2::TiledRgbaOutputFile::numLevels();
    if (iVar2 <= yLevel) break;
    local_64 = 0;
    while( true ) {
      iVar2 = local_64;
      iVar3 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)local_30);
      if (iVar3 <= iVar2) break;
      local_68 = 0;
      while( true ) {
        iVar3 = local_68;
        iVar4 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)local_30);
        if (iVar4 <= iVar3) break;
        Imf_3_2::TiledRgbaOutputFile::dataWindowForTile((int)&local_78,(int)local_30,local_68);
        Imf_3_2::TiledRgbaOutputFile::levelWidth((int)local_30);
        Imf_3_2::TiledRgbaOutputFile::levelHeight((int)local_30);
        iVar6 = local_60;
        drawImage4((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff3c,uVar1),
                   in_stack_ffffffffffffff34,h,in_stack_ffffffffffffff2c,xMax,
                   (int)((ulong)this >> 0x20),iVar3,iVar2,yLevel);
        pRVar5 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_50,(long)-local_74);
        Imf_3_2::TiledRgbaOutputFile::setFrameBuffer(local_30,(ulong)(pRVar5 + -local_78),1);
        Imf_3_2::TiledRgbaOutputFile::writeTile((int)local_30,local_68,local_64);
        local_68 = local_68 + 1;
      }
      local_64 = local_64 + 1;
    }
    local_60 = local_60 + 1;
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff14,iVar6));
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_30);
  return;
}

Assistant:

void
writeTiledRgbaMIP2 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with mipmap levels using a tile-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,    // tile size
        MIPMAP_LEVELS, // level mode
        ROUND_DOWN,    // rounding mode
        WRITE_RGBA);   // channels in file

    Array2D<Rgba> pixels (tileHeight, tileWidth);

    for (int level = 0; level < out.numLevels (); ++level)
    {
        for (int tileY = 0; tileY < out.numYTiles (level); ++tileY)
        {
            for (int tileX = 0; tileX < out.numXTiles (level); ++tileX)
            {
                Box2i range = out.dataWindowForTile (tileX, tileY, level);

                drawImage4 (
                    pixels,
                    out.levelWidth (level),
                    out.levelHeight (level),
                    range.min.x,
                    range.max.x + 1,
                    range.min.y,
                    range.max.y + 1,
                    level,
                    level);

                out.setFrameBuffer (
                    &pixels[-range.min.y][-range.min.x],
                    1,          // xStride
                    tileWidth); // yStride

                out.writeTile (tileX, tileY, level);
            }
        }
    }
}